

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

bool ImGui::ImageButton(Texture *texture,Vector2f *size,int framePadding,Color *bgColor,
                       Color *tintColor)

{
  bool bVar1;
  uint uVar2;
  Vector2f local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec4 local_50;
  ImVec4 local_40;
  
  uVar2 = sf::Texture::getNativeHandle(texture);
  local_68 = *size;
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_60.x = 1.0;
  local_60.y = 1.0;
  local_40 = (ImVec4)anon_unknown.dwarf_115aec::toImColor(*bgColor);
  local_50 = (ImVec4)anon_unknown.dwarf_115aec::toImColor(*tintColor);
  bVar1 = ImageButton((ImTextureID)(ulong)uVar2,(ImVec2 *)&local_68,&local_58,&local_60,framePadding
                      ,&local_40,&local_50);
  return bVar1;
}

Assistant:

bool ImageButton(const sf::Texture& texture, const sf::Vector2f& size, const int framePadding,
                 const sf::Color& bgColor, const sf::Color& tintColor) {
    ImTextureID textureID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());

    return ImGui::ImageButton(textureID, ImVec2(size.x, size.y), ImVec2(0, 0), ImVec2(1, 1),
                              framePadding, toImColor(bgColor), toImColor(tintColor));
}